

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_rand.c
# Opt level: O0

int EVP_RAND_generate(EVP_RAND_CTX *ctx,uchar *out,size_t outlen,uint strength,
                     int prediction_resistance,uchar *addin,size_t addin_len)

{
  int iVar1;
  int res;
  uchar *in_stack_00000058;
  int in_stack_00000060;
  uint in_stack_00000064;
  size_t in_stack_00000068;
  uchar *in_stack_00000070;
  EVP_RAND_CTX *in_stack_00000078;
  size_t in_stack_00000090;
  EVP_RAND_CTX *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  iVar1 = evp_rand_lock(in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = evp_rand_generate_locked
                        (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000064,
                         in_stack_00000060,in_stack_00000058,in_stack_00000090);
    evp_rand_unlock((EVP_RAND_CTX *)0x430f28);
  }
  return local_4;
}

Assistant:

int EVP_RAND_generate(EVP_RAND_CTX *ctx, unsigned char *out, size_t outlen,
                      unsigned int strength, int prediction_resistance,
                      const unsigned char *addin, size_t addin_len)
{
    int res;

    if (!evp_rand_lock(ctx))
        return 0;
    res = evp_rand_generate_locked(ctx, out, outlen, strength,
                                   prediction_resistance, addin, addin_len);
    evp_rand_unlock(ctx);
    return res;
}